

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O3

int tref(lua_State *L)

{
  int iVar1;
  int iVar2;
  
  iVar1 = lua_gettop(L);
  luaL_checkany(L,1);
  lua_pushvalue(L,1);
  iVar2 = luaL_ref(L,-0xf4628);
  lua_pushinteger(L,(long)iVar2);
  iVar2 = lua_gettop(L);
  if (iVar2 == iVar1 + 1) {
    return 1;
  }
  __assert_fail("lua_gettop(L) == level+1",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                ,0x37a,"int tref(lua_State *)");
}

Assistant:

static int tref (lua_State *L) {
  int level = lua_gettop(L);
  luaL_checkany(L, 1);
  lua_pushvalue(L, 1);
  lua_pushinteger(L, luaL_ref(L, LUA_REGISTRYINDEX));
  lua_assert(lua_gettop(L) == level+1);  /* +1 for result */
  return 1;
}